

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O0

Task * AI::create_ChaseLastKnownHeading(void)

{
  Task *in_RDI;
  allocator<char> local_7b9;
  string local_7b8;
  undefined1 local_798 [8];
  Task stopMoving;
  value_type local_418;
  anon_class_1_0_00000001 local_40d;
  value_type local_40c;
  value_type local_408;
  value_type_conflict1 local_3fc;
  value_type_conflict1 local_3f8;
  allocator<char> local_3f1;
  string local_3f0;
  undefined1 local_3d0 [8];
  Task moveAlongHeading;
  value_type local_50 [5];
  allocator<char> local_39;
  string local_38;
  byte local_11;
  Task *chaseHeading;
  
  local_11 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"chaseHeading",&local_39);
  Task::Task(in_RDI,&local_38,Compound);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  in_RDI->identifier = ChaseLastKnownHeading;
  local_50[0] = Player_ForwardVector;
  std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>::push_back
            (&(in_RDI->preconditions).consumableVectors,local_50);
  moveAlongHeading.parameters.flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage._0_4_ = 3;
  moveAlongHeading.parameters.flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage._4_1_ = 0;
  std::vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>::push_back
            ((vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_> *)in_RDI,
             (value_type *)
             &moveAlongHeading.parameters.flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f0,"moveAlongHeading",&local_3f1);
  Task::Task((Task *)local_3d0,&local_3f0,Simple);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator(&local_3f1);
  local_3f8 = 320.0;
  std::vector<float,_std::allocator<float>_>::push_back
            ((vector<float,_std::allocator<float>_> *)
             &moveAlongHeading.parameters.vectors.
              super__Vector_base<Math::Vector3,_std::allocator<Math::Vector3>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_3f8);
  local_3fc = 1000.0;
  std::vector<float,_std::allocator<float>_>::push_back
            ((vector<float,_std::allocator<float>_> *)
             &moveAlongHeading.parameters.vectors.
              super__Vector_base<Math::Vector3,_std::allocator<Math::Vector3>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_3fc);
  local_408.x = 0.0;
  local_408.y = 0.0;
  local_408.z = 1.0;
  std::vector<Math::Vector3,_std::allocator<Math::Vector3>_>::push_back
            ((vector<Math::Vector3,_std::allocator<Math::Vector3>_> *)&moveAlongHeading.isImmediate,
             &local_408);
  local_40c = Player_ForwardVector;
  std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>::push_back
            ((vector<ConsumableFact,_std::allocator<ConsumableFact>_> *)
             &moveAlongHeading.preconditions.consumableValues.
              super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_40c);
  moveAlongHeading.modifiedVectors._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 3;
  std::function<void(AI::Task&,AI::WorldState&,AI::WorldQuerier_const&)>::operator=
            ((function<void(AI::Task&,AI::WorldState&,AI::WorldQuerier_const&)> *)
             &moveAlongHeading.action,&local_40d);
  local_418.identifier = NearDestination;
  local_418.index = -1;
  std::vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>::
  push_back((vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
             *)&moveAlongHeading.postconditions.requiredValues.
                super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_418);
  std::function<void(AI::WorldState&,AI::Task&)>::operator=
            ((function<void(AI::WorldState&,AI::Task&)> *)&moveAlongHeading.setup._M_invoker,
             (anon_class_1_0_00000001 *)
             ((long)&stopMoving.parameters.flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7b8,"stopMoving",&local_7b9);
  Task::Task((Task *)local_798,&local_7b8,Simple);
  std::__cxx11::string::~string((string *)&local_7b8);
  std::allocator<char>::~allocator(&local_7b9);
  stopMoving.modifiedVectors._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 5;
  Task::addSubtask(in_RDI,(Task *)local_3d0);
  Task::addSubtask(in_RDI,(Task *)local_798);
  local_11 = 1;
  Task::~Task((Task *)local_798);
  Task::~Task((Task *)local_3d0);
  if ((local_11 & 1) == 0) {
    Task::~Task(in_RDI);
  }
  return in_RDI;
}

Assistant:

Task create_ChaseLastKnownHeading()
	{
		/*
		1 - move to last known location
		2 - move X distance along heading
		*/

		Task chaseHeading {"chaseHeading", TaskType::Compound};
		chaseHeading.identifier = TaskIdentifier::ChaseLastKnownHeading;
		chaseHeading.preconditions.consumableVectors.push_back(ConsumableFact::Player_ForwardVector);
		chaseHeading.preconditions.requiredFlags.push_back({WorldStateIdentifier::PlayerIdentified, false});

		Task moveAlongHeading {"moveAlongHeading"};
		//amount to move along heading
		//note: should change based when alt paths appear, such as hallway with other paths 
		moveAlongHeading.parameters.values.push_back(320);
		moveAlongHeading.parameters.values.push_back(1000);
		moveAlongHeading.parameters.vectors.push_back({0.f, 0.f, 1.f});
		moveAlongHeading.preconditions.consumableVectors.push_back(ConsumableFact::Player_ForwardVector);
		moveAlongHeading.action = Action::MoveToDestination;		
		moveAlongHeading.setup = [=](Task& task, WorldState& state, const WorldQuerier&)
		{
			auto& currentPosition = state.current.vectors[WorldStateIdentifier::CurrentPosition];
			auto playerForwardVector = state.facts.vectors[ConsumableFact::Player_ForwardVector].value;

			auto destination = currentPosition + playerForwardVector * task.parameters.values[1];
			state.current.vectors[WorldStateIdentifier::Destination] = destination;
		};

		moveAlongHeading.postconditions.satisfiedPredicates.push_back({SatisfiablePredicateIdentifier::NearDestination, -1});
		moveAlongHeading.finish = [](WorldState& state, Task& task)
		{
			state.consumeFactVector(ConsumableFact::Player_ForwardVector);
		};

		Task stopMoving {"stopMoving"};
		stopMoving.action = Action::StopMoving;

		chaseHeading.addSubtask(moveAlongHeading);
		chaseHeading.addSubtask(stopMoving);		

		return chaseHeading;
	}